

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O3

void __thiscall
imrt::EvaluationFunction::create_voxel2beamlet_list
          (EvaluationFunction *this,vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,
          Collimator *collimator)

{
  size_t *psVar1;
  pair<int,_int> pVar2;
  int iVar3;
  int iVar4;
  Matrix *pMVar5;
  key_type kVar6;
  mapped_type *pmVar7;
  _List_node_base *p_Var8;
  _Rb_tree<double,std::pair<double_const,std::pair<int,int>>,std::_Select1st<std::pair<double_const,std::pair<int,int>>>,std::less<double>,std::allocator<std::pair<double_const,std::pair<int,int>>>>
  *this_00;
  key_type kVar9;
  _Node_alloc_type *__alloc;
  ulong uVar10;
  long lVar11;
  long local_98;
  pair<double,_std::pair<int,_int>_> local_78;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *local_68;
  key_type local_60;
  EvaluationFunction *local_58;
  _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_50;
  _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_48;
  pair<int,_int> local_40;
  key_type local_38;
  
  local_68 = volumes;
  iVar3 = Collimator::getNbAngles(collimator);
  if (0 < iVar3) {
    local_48 = (_Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&this->voxel2beamlet_list;
    local_50 = (_Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&this->beamlet2voxel_list;
    iVar3 = 0;
    local_58 = this;
    do {
      if (0 < this->nb_organs) {
        uVar10 = 0;
        do {
          kVar6.first = Collimator::getAngle(collimator,iVar3);
          pMVar5 = Volume::getDepositionMatrix
                             ((local_68->
                              super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>).
                              _M_impl.super__Vector_impl_data._M_start + uVar10,kVar6.first);
          if (0 < (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10]) {
            kVar6.second = 0;
            local_98 = 0;
            local_60 = kVar6;
            do {
              iVar4 = Collimator::getNangleBeamlets(collimator,kVar6.first);
              if (0 < iVar4) {
                local_40 = (pair<int,_int>)(local_98 << 0x20 | uVar10);
                lVar11 = 0;
                kVar9 = local_60;
                do {
                  pVar2 = local_40;
                  if (0.0 < pMVar5->p[local_98][lVar11]) {
                    local_78.first = (double)local_40;
                    pmVar7 = std::__detail::
                             _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             ::operator[](local_48,(key_type *)&local_78);
                    p_Var8 = (_List_node_base *)operator_new(0x18);
                    p_Var8[1]._M_next = (_List_node_base *)kVar9;
                    std::__detail::_List_node_base::_M_hook(p_Var8);
                    psVar1 = &(pmVar7->
                              super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              )._M_impl._M_node._M_size;
                    *psVar1 = *psVar1 + 1;
                    local_38 = kVar9;
                    this_00 = (_Rb_tree<double,std::pair<double_const,std::pair<int,int>>,std::_Select1st<std::pair<double_const,std::pair<int,int>>>,std::less<double>,std::allocator<std::pair<double_const,std::pair<int,int>>>>
                               *)std::__detail::
                                 _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 ::operator[](local_50,&local_38);
                    local_78.first =
                         (double)((ulong)pMVar5->p[local_98][lVar11] | (ulong)DAT_00127020);
                    local_78.second = pVar2;
                    std::
                    _Rb_tree<double,std::pair<double_const,std::pair<int,int>>,std::_Select1st<std::pair<double_const,std::pair<int,int>>>,std::less<double>,std::allocator<std::pair<double_const,std::pair<int,int>>>>
                    ::_M_emplace_equal<std::pair<double,std::pair<int,int>>>(this_00,&local_78);
                  }
                  lVar11 = lVar11 + 1;
                  iVar4 = Collimator::getNangleBeamlets(collimator,kVar6.first);
                  kVar9 = (key_type)((long)kVar9 + 0x100000000);
                } while (lVar11 < iVar4);
              }
              local_98 = local_98 + 1;
              this = local_58;
            } while (local_98 <
                     (local_58->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10]);
          }
          uVar10 = uVar10 + 1;
        } while ((long)uVar10 < (long)this->nb_organs);
      }
      iVar3 = iVar3 + 1;
      iVar4 = Collimator::getNbAngles(collimator);
    } while (iVar3 < iVar4);
  }
  return;
}

Assistant:

void EvaluationFunction::create_voxel2beamlet_list(vector<Volume>& volumes, const Collimator& collimator){
	for (int i=0;i<collimator.getNbAngles();i++){
		for(int o=0; o<nb_organs; o++){
			 int angle = collimator.getAngle(i);
			 const Matrix&  D = volumes[o].getDepositionMatrix(angle);
			 for(int k=0; k<nb_voxels[o]; k++){
				 for(int b=0; b<collimator.getNangleBeamlets(angle); b++)
					 if(D(k,b) > 0.0) {
						 voxel2beamlet_list[make_pair(o,k)].push_back(make_pair(angle,b));
						 beamlet2voxel_list[make_pair(angle,b)].insert(make_pair(-abs(D(k,b)), make_pair(o,k)));
					 }
			 }
		}
	}
}